

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::insert(QTextDocumentPrivate *this,int pos,QStringView str,int format)

{
  QStringView v;
  int pos_00;
  qsizetype qVar1;
  storage_type_conflict *in_RDX;
  undefined4 in_ESI;
  qsizetype in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  int strPos;
  int in_stack_ffffffffffffffc0;
  qsizetype qVar2;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = in_RDI;
  local_18.m_size = (qsizetype)in_RDX;
  qVar1 = QStringView::size(&local_18);
  if (qVar1 != 0) {
    qVar1 = QString::size((QString *)(in_RDI + 0x80));
    pos_00 = (int)qVar1;
    v.m_data = (storage_type_conflict *)local_18.m_size;
    v.m_size = qVar2;
    QString::append((QString *)CONCAT44(in_ESI,in_R8D),v);
    QStringView::size(&local_18);
    insert((QTextDocumentPrivate *)CONCAT44(in_ESI,in_R8D),pos_00,in_stack_ffffffffffffffc0,
           (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::insert(int pos, QStringView str, int format)
{
    if (str.size() == 0)
        return;

    Q_ASSERT(noBlockInString(str));

    int strPos = text.size();
    text.append(str);
    insert(pos, strPos, str.size(), format);
}